

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O2

void disas_simd_three_reg_same(DisasContext_conflict1 *s,uint32_t insn)

{
  TCGContext_conflict1 *pTVar1;
  byte bVar2;
  _Bool _Var3;
  ulong uVar4;
  TCGv_i64 tcg_dest;
  TCGv_i64 tcg_dest_00;
  TCGv_i64 tcg_rd;
  TCGv_i32 tcg_dest_01;
  TCGv_i32 tcg_dest_02;
  TCGv_i32 tcg_src;
  GVecGen4_conflict1 *pGVar5;
  uint uVar6;
  int is_2;
  uint uVar7;
  uintptr_t o_2;
  TCGCond cond;
  uint32_t uVar8;
  uint uVar9;
  uint32_t uVar10;
  GVecGen3_conflict1 *pGVar11;
  uint32_t uVar12;
  uint fpopcode;
  uint rn;
  uint32_t bofs;
  uint32_t uVar13;
  uint uVar14;
  uintptr_t o_3;
  int is_s;
  uint uVar15;
  int iVar16;
  uint uVar17;
  uintptr_t o_1;
  uint local_c8;
  ushort local_b0;
  
  fpopcode = insn >> 0xb & 0x1f;
  bVar2 = (byte)(insn >> 0x18);
  if ((ushort)fpopcode < 0x20) {
    if ((0xff000000U >> fpopcode & 1) != 0) {
      uVar17 = insn >> 0x1e & 1;
      uVar14 = insn >> 0x16 & 1;
      if (uVar14 != 0 && (bVar2 >> 6 & 1) == 0) goto LAB_00633921;
      pTVar1 = s->uc->tcg_ctx;
      uVar15 = insn >> 0x17 & 1;
      uVar7 = insn >> 0x1d & 1;
      fpopcode = uVar7 << 6 | uVar15 << 5 | fpopcode;
      uVar6 = insn >> 0x10 & 0x1f;
      uVar9 = insn >> 5 & 0x1f;
      if (fpopcode < 0x40) {
        if ((0xc7000000df000000U >> ((ulong)fpopcode & 0x3f) & 1) != 0) goto LAB_0063360a;
        if ((0x2000000020000000U >> ((ulong)fpopcode & 0x3f) & 1) == 0) goto LAB_00633554;
      }
      else {
LAB_00633554:
        uVar4 = (ulong)(fpopcode - 0x58);
        if (0x26 < fpopcode - 0x58) goto LAB_00633921;
        if ((0x34000000b8U >> (uVar4 & 0x3f) & 1) != 0) {
LAB_0063360a:
          local_c8 = insn >> 5 & 0x1f;
          _Var3 = fp_access_check(s);
          if (!_Var3) {
            return;
          }
          handle_3same_float(s,uVar14,uVar17 * 0x40 + 0x40 >> (char)uVar14 + 5,fpopcode,insn & 0x1f,
                             local_c8,uVar6);
          return;
        }
        if ((0x4100000045U >> (uVar4 & 0x3f) & 1) != 0) {
          uVar14 = uVar14 | 2;
          uVar6 = 0;
LAB_0063371b:
          handle_simd_3same_pair
                    (s,uVar17,uVar6,fpopcode,uVar14,uVar9,insn >> 0x10 & 0x1f,insn & 0x1f);
          return;
        }
        if ((0x200000002U >> (uVar4 & 0x3f) & 1) == 0) goto LAB_00633921;
      }
      if ((uVar14 == 0) && ((s->isar->id_aa64isar0 & 0xf000000000000) != 0)) {
        _Var3 = fp_access_check(s);
        if (!_Var3) {
          return;
        }
        tcg_gen_gvec_3_ptr_aarch64
                  (pTVar1,(insn & 0x1f) * 0x100 + 0xc10,uVar9 * 0x100 + 0xc10,uVar6 * 0x100 + 0xc10,
                   pTVar1->cpu_env,uVar17 * 8 + 8,s->sve_len,uVar15 + uVar7 * 2,
                   gen_helper_gvec_fmlal_a64);
        return;
      }
      goto LAB_00633921;
    }
    if ((0xb00000U >> fpopcode & 1) != 0) {
      uVar17 = insn >> 0x1e & 1;
      uVar6 = insn >> 0x1d & 1;
      uVar14 = insn >> 0x16 & 3;
      if (fpopcode == 0x17) {
        if ((uVar6 != 0) || (uVar14 == 3 && uVar17 == 0)) goto LAB_00633921;
      }
      else if (uVar14 == 3) goto LAB_00633921;
      uVar9 = insn >> 5 & 0x1f;
      goto LAB_0063371b;
    }
    if (fpopcode == 3) {
      _Var3 = fp_access_check(s);
      if (!_Var3) {
        return;
      }
      (*(code *)(&DAT_00b8572c +
                *(int *)(&DAT_00b8572c + (ulong)(insn >> 0x1b & 4 | insn >> 0x16 & 3) * 4)))
                (s,insn,insn & 0x1f,&DAT_00b8572c,
                 &DAT_00b8572c +
                 *(int *)(&DAT_00b8572c + (ulong)(insn >> 0x1b & 4 | insn >> 0x16 & 3) * 4));
      return;
    }
  }
  pTVar1 = s->uc->tcg_ctx;
  uVar17 = insn >> 0x1e;
  uVar14 = insn >> 0x1d & 1;
  uVar6 = insn >> 0x16 & 3;
  if ((ushort)fpopcode < 0x17) {
    if ((0x4f015U >> fpopcode & 1) == 0) {
      if (fpopcode != 0x13) {
        if (fpopcode != 0x16) goto LAB_006338f8;
        if ((uVar6 == 3) || (uVar6 == 0)) goto LAB_00633921;
        goto LAB_00633784;
      }
      if (uVar6 != 0 && uVar14 != 0) goto LAB_00633921;
    }
    if (uVar6 == 3) {
LAB_00633921:
      unallocated_encoding_aarch64(s);
      return;
    }
  }
  else {
LAB_006338f8:
    if ((uVar17 & 1) == 0 && uVar6 == 3) goto LAB_00633921;
  }
LAB_00633784:
  uVar7 = insn >> 0xb & 0x1f;
  _Var3 = fp_access_check(s);
  if (!_Var3) {
    return;
  }
  uVar15 = insn >> 0x10 & 0x1f;
  rn = insn >> 5 & 0x1f;
  uVar9 = insn & 0x1f;
  switch(fpopcode) {
  case 1:
    uVar12 = uVar9 * 0x100 + 0xc10;
    bofs = rn * 0x100 + 0xc10;
    uVar13 = uVar15 * 0x100 + 0xc10;
    uVar10 = (uVar17 & 1) * 8 + 8;
    uVar8 = s->sve_len;
    if (uVar14 == 0) {
      pGVar5 = sqadd_op_aarch64;
    }
    else {
      pGVar5 = uqadd_op_aarch64;
    }
    goto LAB_00633e6b;
  default:
    if (uVar6 == 3) {
      if ((uVar17 & 1) == 0) {
        __assert_fail("is_q",
                      "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                      ,0x2d3b,"void disas_simd_3same_int(DisasContext *, uint32_t)");
      }
      for (iVar16 = 0; iVar16 != 2; iVar16 = iVar16 + 1) {
        tcg_dest = tcg_temp_new_i64(pTVar1);
        tcg_dest_00 = tcg_temp_new_i64(pTVar1);
        tcg_rd = tcg_temp_new_i64(pTVar1);
        read_vec_element(s,tcg_dest,rn,iVar16,MO_64);
        read_vec_element(s,tcg_dest_00,uVar15,iVar16,MO_64);
        handle_3same_64(s,uVar7,SUB41(uVar14,0),tcg_rd,tcg_dest,tcg_dest_00);
        write_vec_element(s,tcg_rd,uVar9,iVar16,MO_64);
        tcg_temp_free_internal_aarch64(pTVar1,(TCGTemp *)(tcg_rd + (long)pTVar1));
        tcg_temp_free_internal_aarch64(pTVar1,(TCGTemp *)(tcg_dest + (long)pTVar1));
        tcg_temp_free_internal_aarch64(pTVar1,(TCGTemp *)(tcg_dest_00 + (long)pTVar1));
      }
    }
    else {
      for (iVar16 = 0; (uVar17 & 1) * 2 + 2 != iVar16; iVar16 = iVar16 + 1) {
        tcg_dest_01 = tcg_temp_new_i32(pTVar1);
        tcg_dest_02 = tcg_temp_new_i32(pTVar1);
        tcg_src = tcg_temp_new_i32(pTVar1);
        read_vec_element_i32(s,tcg_dest_01,rn,iVar16,MO_32);
        read_vec_element_i32(s,tcg_dest_02,uVar15,iVar16,MO_32);
        local_b0 = (ushort)uVar7;
        if (local_b0 < 0x10) {
          (*(code *)(&DAT_00b85798 + *(int *)(&DAT_00b85798 + (ulong)fpopcode * 4)))();
          return;
        }
        if (fpopcode != 0x16) {
          g_assertion_message_expr
                    ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                     ,0x2daa,(char *)0x0);
        }
        if (1 < uVar6 - 1) {
          __assert_fail("size == 1 || size == 2",
                        "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                        ,0x2da5,"void disas_simd_3same_int(DisasContext *, uint32_t)");
        }
        (**(code **)((long)disas_simd_scalar_three_reg_same::fns_4[uVar6 - 1] + (ulong)(uVar14 << 3)
                    ))(pTVar1,tcg_src,pTVar1->cpu_env,tcg_dest_01,tcg_dest_02);
        if (uVar7 == 0xf) {
          read_vec_element_i32(s,tcg_dest_01,uVar9,iVar16,MO_32);
          (**(code **)(disas_simd_3same_int_fns_69 + (ulong)uVar6 * 8))
                    (pTVar1,tcg_src,tcg_dest_01,tcg_src);
        }
        write_vec_element_i32(s,tcg_src,uVar9,iVar16,MO_32);
        tcg_temp_free_internal_aarch64(pTVar1,(TCGTemp *)(tcg_src + (long)pTVar1));
        tcg_temp_free_internal_aarch64(pTVar1,(TCGTemp *)(tcg_dest_01 + (long)pTVar1));
        tcg_temp_free_internal_aarch64(pTVar1,(TCGTemp *)(tcg_dest_02 + (long)pTVar1));
      }
    }
    clear_vec_high(s,(_Bool)(bVar2 >> 6 & 1),uVar9);
    return;
  case 5:
    uVar12 = uVar9 * 0x100 + 0xc10;
    bofs = rn * 0x100 + 0xc10;
    uVar13 = uVar15 * 0x100 + 0xc10;
    uVar10 = (uVar17 & 1) * 8 + 8;
    uVar8 = s->sve_len;
    if (uVar14 == 0) {
      pGVar5 = sqsub_op_aarch64;
    }
    else {
      pGVar5 = uqsub_op_aarch64;
    }
LAB_00633e6b:
    tcg_gen_gvec_4_aarch64(pTVar1,uVar12,0x2e50,bofs,uVar13,uVar10,uVar8,pGVar5 + uVar6);
    break;
  case 6:
    cond = uVar14 * 2 + TCG_COND_GT;
    goto LAB_00633b8c;
  case 7:
    cond = uVar14 * 2 + TCG_COND_GE;
    goto LAB_00633b8c;
  case 8:
    _Var3 = (_Bool)(bVar2 >> 6 & 1);
    if (uVar14 == 0) {
      pGVar11 = sshl_op_aarch64;
    }
    else {
      pGVar11 = ushl_op_aarch64;
    }
    pGVar11 = pGVar11 + uVar6;
    goto LAB_00633eda;
  case 0xc:
    uVar8 = uVar9 * 0x100 + 0xc10;
    uVar13 = rn * 0x100 + 0xc10;
    uVar12 = uVar15 * 0x100 + 0xc10;
    pTVar1 = s->uc->tcg_ctx;
    uVar10 = (uVar17 & 1) * 8 + 8;
    if (uVar14 == 0) {
      tcg_gen_gvec_smax_aarch64(pTVar1,uVar6,uVar8,uVar13,uVar12,uVar10,s->sve_len);
    }
    else {
      tcg_gen_gvec_umax_aarch64(pTVar1,uVar6,uVar8,uVar13,uVar12,uVar10,s->sve_len);
    }
    break;
  case 0xd:
    uVar8 = uVar9 * 0x100 + 0xc10;
    uVar13 = rn * 0x100 + 0xc10;
    uVar12 = uVar15 * 0x100 + 0xc10;
    pTVar1 = s->uc->tcg_ctx;
    uVar10 = (uVar17 & 1) * 8 + 8;
    if (uVar14 == 0) {
      tcg_gen_gvec_smin_aarch64(pTVar1,uVar6,uVar8,uVar13,uVar12,uVar10,s->sve_len);
    }
    else {
      tcg_gen_gvec_umin_aarch64(pTVar1,uVar6,uVar8,uVar13,uVar12,uVar10,s->sve_len);
    }
    break;
  case 0x10:
    uVar8 = uVar9 * 0x100 + 0xc10;
    uVar13 = rn * 0x100 + 0xc10;
    uVar12 = uVar15 * 0x100 + 0xc10;
    pTVar1 = s->uc->tcg_ctx;
    uVar10 = (uVar17 & 1) * 8 + 8;
    if (uVar14 == 0) {
      tcg_gen_gvec_add_aarch64(pTVar1,uVar6,uVar8,uVar13,uVar12,uVar10,s->sve_len);
    }
    else {
      tcg_gen_gvec_sub_aarch64(pTVar1,uVar6,uVar8,uVar13,uVar12,uVar10,s->sve_len);
    }
    break;
  case 0x11:
    if (uVar14 == 0) {
      _Var3 = (_Bool)(bVar2 >> 6 & 1);
      pGVar11 = cmtst_op_aarch64 + uVar6;
      goto LAB_00633eda;
    }
    cond = TCG_COND_EQ;
LAB_00633b8c:
    tcg_gen_gvec_cmp_aarch64
              (pTVar1,cond,uVar6,uVar9 * 0x100 + 0xc10,rn * 0x100 + 0xc10,uVar15 * 0x100 + 0xc10,
               (uVar17 & 1) * 8 + 8,s->sve_len);
    break;
  case 0x12:
    if (uVar14 == 0) {
      _Var3 = (_Bool)(bVar2 >> 6 & 1);
      pGVar11 = mla_op_aarch64 + uVar6;
    }
    else {
      _Var3 = (_Bool)(bVar2 >> 6 & 1);
      pGVar11 = mls_op_aarch64 + uVar6;
    }
LAB_00633eda:
    gen_gvec_op3(s,_Var3,uVar9,rn,uVar15,pGVar11);
    return;
  case 0x13:
    if (uVar14 == 0) {
      tcg_gen_gvec_mul_aarch64
                (s->uc->tcg_ctx,uVar6,uVar9 * 0x100 + 0xc10,rn * 0x100 + 0xc10,
                 uVar15 * 0x100 + 0xc10,(uVar17 & 1) * 8 + 8,s->sve_len);
    }
    else {
      gen_gvec_op3_ool(s,(_Bool)(bVar2 >> 6 & 1),uVar9,rn,uVar15,0,gen_helper_gvec_pmul_b);
    }
  }
  return;
}

Assistant:

static void disas_simd_three_reg_same(DisasContext *s, uint32_t insn)
{
    int opcode = extract32(insn, 11, 5);

    switch (opcode) {
    case 0x3: /* logic ops */
        disas_simd_3same_logic(s, insn);
        break;
    case 0x17: /* ADDP */
    case 0x14: /* SMAXP, UMAXP */
    case 0x15: /* SMINP, UMINP */
    {
        /* Pairwise operations */
        int is_q = extract32(insn, 30, 1);
        int u = extract32(insn, 29, 1);
        int size = extract32(insn, 22, 2);
        int rm = extract32(insn, 16, 5);
        int rn = extract32(insn, 5, 5);
        int rd = extract32(insn, 0, 5);
        if (opcode == 0x17) {
            if (u || (size == 3 && !is_q)) {
                unallocated_encoding(s);
                return;
            }
        } else {
            if (size == 3) {
                unallocated_encoding(s);
                return;
            }
        }
        handle_simd_3same_pair(s, is_q, u, opcode, size, rn, rm, rd);
        break;
    }
    case 0x18:
    case 0x19:
    case 0x1a:
    case 0x1b:
    case 0x1c:
    case 0x1d:
    case 0x1e:
    case 0x1f:
    case 0x20:
    case 0x21:
    case 0x22:
    case 0x23:
    case 0x24:
    case 0x25:
    case 0x26:
    case 0x27:
    case 0x28:
    case 0x29:
    case 0x2a:
    case 0x2b:
    case 0x2c:
    case 0x2d:
    case 0x2e:
    case 0x2f:
    case 0x30:
    case 0x31:
        /* floating point ops, sz[1] and U are part of opcode */
        disas_simd_3same_float(s, insn);
        break;
    default:
        disas_simd_3same_int(s, insn);
        break;
    }
}